

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O3

void __thiscall
TPZCompElHCurl<pzshape::TPZShapeTriang>::ComputeSolutionHCurlT<double>
          (TPZCompElHCurl<pzshape::TPZShapeTriang> *this,TPZFMatrix<double> *phiHCurl,
          TPZFMatrix<double> *curlPhi,TPZSolVec<double> *sol,TPZSolVec<double> *curlSol)

{
  double dVar1;
  long lVar2;
  TPZManVector<double,_10> *pTVar3;
  TNode *pTVar4;
  long lVar5;
  long lVar6;
  double *pdVar7;
  bool bVar8;
  int iVar9;
  long *plVar10;
  TPZCompMesh *pTVar11;
  TPZFMatrix<double> *pTVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  int iVar17;
  long lVar18;
  double extraout_XMM0_Qa;
  long local_90;
  double local_58;
  TPZCompMesh *local_50;
  long local_48;
  long local_40;
  TPZFMatrix<double> *local_38;
  
  local_38 = curlPhi;
  plVar10 = (long *)(**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTriang>).
                                           super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                           super_TPZCompEl + 0xb8))();
  (**(code **)(*plVar10 + 0x78))(plVar10);
  iVar9 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTriang>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x90))(this);
  pTVar11 = TPZCompEl::Mesh((TPZCompEl *)this);
  pTVar12 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar11->fSolution);
  lVar2 = (pTVar12->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  (*(sol->super_TPZVec<TPZManVector<double,_10>_>)._vptr_TPZVec[3])(sol,lVar2);
  (*(curlSol->super_TPZVec<TPZManVector<double,_10>_>)._vptr_TPZVec[3])(curlSol,lVar2);
  if (0 < lVar2) {
    lVar18 = 0;
    lVar13 = lVar2;
    do {
      pTVar3 = (sol->super_TPZVec<TPZManVector<double,_10>_>).fStore;
      (**(code **)(*(long *)((long)pTVar3->fExtAlloc + lVar18 + -0x20) + 0x18))
                ((long)pTVar3->fExtAlloc + lVar18 + -0x20,2);
      local_58 = 0.0;
      TPZVec<double>::Fill
                ((TPZVec<double> *)
                 ((long)((sol->super_TPZVec<TPZManVector<double,_10>_>).fStore)->fExtAlloc +
                 lVar18 + -0x20),&local_58,0,-1);
      pTVar3 = (curlSol->super_TPZVec<TPZManVector<double,_10>_>).fStore;
      (**(code **)(*(long *)((long)pTVar3->fExtAlloc + lVar18 + -0x20) + 0x18))
                ((long)pTVar3->fExtAlloc + lVar18 + -0x20,1);
      local_58 = 0.0;
      TPZVec<double>::Fill
                ((TPZVec<double> *)
                 ((long)((curlSol->super_TPZVec<TPZManVector<double,_10>_>).fStore)->fExtAlloc +
                 lVar18 + -0x20),&local_58,0,-1);
      lVar18 = lVar18 + 0x70;
      lVar13 = lVar13 + -1;
    } while (lVar13 != 0);
  }
  local_50 = TPZCompEl::Mesh((TPZCompEl *)this);
  if (0 < iVar9) {
    lVar13 = 0;
    iVar17 = 0;
    do {
      lVar18 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTriang>).
                                      super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                      super_TPZCompEl + 0xa8))(this,iVar17);
      pTVar4 = (local_50->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
      local_40 = (long)pTVar4[*(int *)(lVar18 + 8)].dim;
      if (0 < local_40) {
        local_48 = (long)pTVar4[*(int *)(lVar18 + 8)].pos;
        lVar13 = (long)(int)lVar13;
        local_90 = 0;
        do {
          if (0 < lVar2) {
            lVar18 = local_90 + local_48;
            lVar15 = 0;
            do {
              lVar14 = 0;
              bVar8 = true;
              do {
                bVar16 = bVar8;
                if (((lVar18 < 0) ||
                    (lVar5 = (pTVar12->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow,
                    lVar5 <= lVar18)) ||
                   ((pTVar12->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar15)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if (((lVar13 < 0) ||
                    (lVar6 = (phiHCurl->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow,
                    lVar6 <= lVar13)) ||
                   ((phiHCurl->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar14)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x278);
                }
                pdVar7 = (sol->super_TPZVec<TPZManVector<double,_10>_>).fStore[lVar15].
                         super_TPZVec<double>.fStore;
                pdVar7[lVar14] =
                     pTVar12->fElem[lVar5 * lVar15 + lVar18] *
                     phiHCurl->fElem[lVar6 * lVar14 + lVar13] + pdVar7[lVar14];
                lVar14 = 1;
                bVar8 = false;
              } while (bVar16);
              if (((lVar18 < 0) ||
                  (lVar14 = (pTVar12->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow,
                  lVar14 <= lVar18)) ||
                 ((pTVar12->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar15)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              dVar1 = pTVar12->fElem[lVar14 * lVar15 + lVar18];
              (*(local_38->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x21])(local_38,0,lVar13);
              pdVar7 = (curlSol->super_TPZVec<TPZManVector<double,_10>_>).fStore[lVar15].
                       super_TPZVec<double>.fStore;
              *pdVar7 = extraout_XMM0_Qa * dVar1 + *pdVar7;
              lVar15 = lVar15 + 1;
            } while (lVar15 != lVar2);
          }
          lVar13 = lVar13 + 1;
          local_90 = local_90 + 1;
        } while (local_90 != local_40);
      }
      iVar17 = iVar17 + 1;
    } while (iVar17 != iVar9);
  }
  return;
}

Assistant:

void TPZCompElHCurl<TSHAPE>::ComputeSolutionHCurlT(
  const TPZFMatrix<REAL> &phiHCurl, const TPZFMatrix<REAL> &curlPhi,
    TPZSolVec<TVar> &sol, TPZSolVec<TVar> &curlSol)
{
    constexpr int dim = TSHAPE::Dimension;
    constexpr int curlDim = [dim](){
        if constexpr (dim == 1) return 1;
        else{
            return 2*dim - 3;//1 for 2D 3 for 3D
        }
    }();
    const int nVar = this->Material()->NStateVariables();
    const int nConnects = this->NConnects();

    TPZFMatrix<TVar> &meshSol = this->Mesh()->Solution();

    long numberSol = meshSol.Cols();
#ifdef PZDEBUG
    if (numberSol != 1 || nVar != 1) {
        DebugStop();
    }
#endif

    sol.Resize(numberSol);
    curlSol.Resize(numberSol);

    for (long iSol = 0; iSol < numberSol; iSol++) {
        sol[iSol].Resize(dim);
        sol[iSol].Fill(0);
        curlSol[iSol].Resize(curlDim);
        curlSol[iSol].Fill(0);
    }

    TPZBlock &block = this->Mesh()->Block();
    int ishape = 0;
    for (int iCon = 0; iCon < nConnects; iCon++) {
        TPZConnect *con = &this->Connect(iCon);
        const auto conSeqN = con->SequenceNumber();
        const auto nShapeCon = block.Size(conSeqN);
        const auto pos = block.Position(conSeqN);

        for (int jShape = 0; jShape < nShapeCon; jShape++) {

            for (long iSol = 0; iSol < numberSol; iSol++) {
                for (int coord = 0; coord < dim; coord++) {
                    sol[iSol][coord] +=
                            (TVar)meshSol(pos + jShape, iSol) * phiHCurl(ishape, coord);
                }
                for (int coord = 0; coord < curlDim; coord++) {
                    curlSol[iSol][coord] +=
                            (TVar)meshSol(pos + jShape, iSol) * curlPhi.Get(coord, ishape);
                }
            }
            ishape++;
        }
    }
}